

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageRotateCCW(Image *image)

{
  int iVar1;
  void *pvVar2;
  int height;
  int width;
  int i;
  int x;
  int y;
  uchar *rotatedData;
  int bytesPerPixel;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (image->format < 0xb) {
      iVar1 = GetPixelDataSize(1,1,image->format);
      pvVar2 = malloc((long)(image->width * image->height * iVar1));
      for (i = 0; i < image->height; i = i + 1) {
        for (width = 0; width < image->width; width = width + 1) {
          for (height = 0; height < iVar1; height = height + 1) {
            *(undefined1 *)((long)pvVar2 + (long)((width * image->height + i) * iVar1 + height)) =
                 *(undefined1 *)
                  ((long)image->data +
                  (long)((i * image->width + (image->width - width) + -1) * iVar1 + height));
          }
        }
      }
      free(image->data);
      image->data = pvVar2;
      iVar1 = image->width;
      image->width = image->height;
      image->height = iVar1;
    }
    else {
      TraceLog(4,"Image manipulation not supported for compressed formats");
    }
  }
  return;
}

Assistant:

void ImageRotateCCW(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                //memcpy(rotatedData + (x*image->height + y))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + (image->width - x - 1))*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) rotatedData[(x*image->height + y)*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + (image->width - x - 1))*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        int width = image->width;
        int height = image-> height;

        image->width = height;
        image->height = width;
    }
}